

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no-prefix-set.cpp
# Opt level: O0

bool __thiscall Trie<char,_10UL,_'a'>::good(Trie<char,_10UL,__a_> *this,string *word)

{
  ulong uVar1;
  ulong uVar2;
  char *pcVar3;
  Trie<char,_10UL,__a_> *this_00;
  difference_type dVar4;
  void *local_38;
  int local_30;
  int local_2c;
  int index;
  int i;
  Trie<char,_10UL,__a_> *root;
  string *word_local;
  Trie<char,_10UL,__a_> *this_local;
  
  local_2c = 0;
  _index = this;
  root = (Trie<char,_10UL,__a_> *)word;
  word_local = (string *)this;
  while( true ) {
    uVar1 = (ulong)local_2c;
    uVar2 = std::__cxx11::string::size();
    if (uVar2 <= uVar1) {
      _index->counter = _index->counter + 1;
      local_38 = (void *)0x0;
      dVar4 = std::count<Trie<char,10ul,(char)97>**,decltype(nullptr)>
                        (_index->nodes,(Trie<char,_10UL,__a_> **)&_index->counter,&local_38);
      return dVar4 == 10;
    }
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)root);
    local_30 = *pcVar3 + -0x61;
    if (_index->nodes[local_30] == (Trie<char,_10UL,__a_> *)0x0) {
      this_00 = (Trie<char,_10UL,__a_> *)operator_new(0x58);
      memset(this_00,0,0x58);
      Trie(this_00);
      _index->nodes[local_30] = this_00;
    }
    _index = _index->nodes[local_30];
    if (_index->counter != 0) break;
    local_2c = local_2c + 1;
  }
  return false;
}

Assistant:

bool good(const std::string &word) {
    auto root = this;
    for (auto i = 0; i < word.size(); ++i) {
      auto index = word[i] - offset;
      if (root->nodes[index] == nullptr) {
        root->nodes[index] = new Trie<Element, N, offset>();
      }
      root = root->nodes[index];
      if (root->counter != 0) {
        return false;
      }
    }
    root->counter += 1;
    return std::count(root->nodes, root->nodes + N, nullptr) == N;
  }